

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<unsigned_char>,unsigned_char,duckdb::MaxOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  byte bVar1;
  unsigned_long *puVar2;
  byte *pbVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  ulong uVar16;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar6 = input->data;
      pdVar7 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar13 = 0;
        do {
          pbVar3 = *(byte **)(pdVar7 + iVar13 * 8);
          bVar1 = pdVar6[iVar13];
          if (pbVar3[1] == 0) {
            *pbVar3 = bVar1;
            pbVar3[1] = 1;
          }
          else if (*pbVar3 < bVar1) {
            *pbVar3 = bVar1;
          }
          iVar13 = iVar13 + 1;
        } while (count != iVar13);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar9 = 0;
      uVar11 = 0;
      do {
        uVar8 = puVar2[uVar9];
        uVar10 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar10 = count;
        }
        uVar12 = uVar10;
        if (uVar8 != 0) {
          uVar12 = uVar11;
          if (uVar8 == 0xffffffffffffffff) {
            if (uVar11 < uVar10) {
              do {
                pbVar3 = *(byte **)(pdVar7 + uVar11 * 8);
                bVar1 = pdVar6[uVar11];
                if (pbVar3[1] == 0) {
                  *pbVar3 = bVar1;
                  pbVar3[1] = 1;
                }
                else if (*pbVar3 < bVar1) {
                  *pbVar3 = bVar1;
                }
                uVar11 = uVar11 + 1;
                uVar12 = uVar10;
              } while (uVar10 != uVar11);
            }
          }
          else if (uVar11 < uVar10) {
            uVar16 = 0;
            do {
              if ((uVar8 >> (uVar16 & 0x3f) & 1) != 0) {
                pbVar3 = *(byte **)(pdVar7 + uVar16 * 8 + uVar11 * 8);
                bVar1 = pdVar6[uVar16 + uVar11];
                if (pbVar3[1] == 0) {
                  *pbVar3 = bVar1;
                  pbVar3[1] = 1;
                }
                else if (*pbVar3 < bVar1) {
                  *pbVar3 = bVar1;
                }
              }
              uVar16 = uVar16 + 1;
              uVar12 = uVar10;
            } while (uVar10 - uVar11 != uVar16);
          }
        }
        uVar9 = uVar9 + 1;
        uVar11 = uVar12;
      } while (uVar9 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      return;
    }
    pbVar3 = *(byte **)states->data;
    bVar1 = *input->data;
    if (pbVar3[1] == 0) {
      *pbVar3 = bVar1;
      pbVar3[1] = 1;
      return;
    }
    if (bVar1 <= *pbVar3) {
      return;
    }
    *pbVar3 = bVar1;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_b8.sel)->sel_vector;
      psVar5 = (local_70.sel)->sel_vector;
      iVar13 = 0;
      do {
        iVar14 = iVar13;
        if (psVar4 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar4[iVar13];
        }
        iVar15 = iVar13;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[iVar13];
        }
        pbVar3 = *(byte **)(local_70.data + iVar15 * 8);
        bVar1 = local_b8.data[iVar14];
        if (pbVar3[1] == 0) {
          *pbVar3 = bVar1;
          pbVar3[1] = 1;
        }
        else if (*pbVar3 < bVar1) {
          *pbVar3 = bVar1;
        }
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
  }
  else if (count != 0) {
    psVar4 = (local_b8.sel)->sel_vector;
    psVar5 = (local_70.sel)->sel_vector;
    iVar13 = 0;
    do {
      iVar14 = iVar13;
      if (psVar4 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar4[iVar13];
      }
      iVar15 = iVar13;
      if (psVar5 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar5[iVar13];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
           >> (iVar14 & 0x3f) & 1) != 0) {
        pbVar3 = *(byte **)(local_70.data + iVar15 * 8);
        bVar1 = local_b8.data[iVar14];
        if (pbVar3[1] == 0) {
          *pbVar3 = bVar1;
          pbVar3[1] = 1;
        }
        else if (*pbVar3 < bVar1) {
          *pbVar3 = bVar1;
        }
      }
      iVar13 = iVar13 + 1;
    } while (count != iVar13);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}